

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOMaterial.cpp
# Opt level: O2

char __thiscall
Assimp::LWOImporter::FindUVChannels
          (LWOImporter *this,TextureList *list,Layer *param_2,UVChannel *uv,uint next)

{
  __type _Var1;
  Logger *this_00;
  char cVar2;
  _List_node_base *p_Var3;
  TextureList *__range1;
  
  cVar2 = '\0';
  p_Var3 = (_List_node_base *)list;
  while (p_Var3 = (((_List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_> *)
                   &p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var3 != (_List_node_base *)list) {
    if (((*(undefined1 *)((long)&p_Var3[6]._M_next + 4) == '\x01') &&
        (*(undefined1 *)((long)&p_Var3[6]._M_prev + 4) == '\x01')) &&
       (*(int *)&p_Var3[7]._M_next == 5)) {
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (p_Var3 + 4),&(uv->super_VMapEntry).name);
      if (_Var1) {
        if (*(uint *)&p_Var3[6]._M_next == 0xffffffff || *(uint *)&p_Var3[6]._M_next == next) {
          *(uint *)&p_Var3[6]._M_next = next;
          cVar2 = '\x01';
        }
        else {
          this_00 = DefaultLogger::get();
          Logger::warn(this_00,"LWO: Channel mismatch, would need to duplicate surface [design bug]"
                      );
          cVar2 = '\x01';
        }
      }
    }
  }
  return cVar2;
}

Assistant:

char LWOImporter::FindUVChannels(LWO::TextureList& list,
    LWO::Layer& /*layer*/,LWO::UVChannel& uv, unsigned int next)
{
    char ret = 0;
    for (auto &texture : list)  {

        // Ignore textures with non-UV mappings for the moment.
        if (!texture.enabled || !texture.bCanUse || texture.mapMode != LWO::Texture::UV)  {
            continue;
        }

        if (texture.mUVChannelIndex == uv.name) {
            ret = 1;

            // got it.
            if (texture.mRealUVIndex == UINT_MAX || texture.mRealUVIndex == next)
            {
                texture.mRealUVIndex = next;
            }
            else {
                // channel mismatch. need to duplicate the material.
                ASSIMP_LOG_WARN("LWO: Channel mismatch, would need to duplicate surface [design bug]");

                // TODO
            }
        }
    }
    return ret;
}